

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadUntilNewline(AsciiParser *this,string *str)

{
  StreamReader *pSVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char d;
  char c;
  stringstream ss;
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  do {
    bVar2 = Eof(this);
    if (bVar2) goto LAB_002b192a;
    bVar2 = Char1(this,&c);
    if (!bVar2) goto LAB_002b195c;
    if (c == '\r') {
      if (this->_sr->length_ - 1 <= this->_sr->idx_) goto LAB_002b1910;
      bVar2 = Char1(this,&d);
      iVar3 = 1;
      if ((bVar2) && (iVar3 = 3, d != '\n')) {
        pSVar1 = this->_sr;
        iVar3 = 1;
        if (0 < (long)pSVar1->idx_) {
          uVar4 = pSVar1->idx_ - 1;
          iVar3 = 1;
          if (uVar4 <= pSVar1->length_) {
            pSVar1->idx_ = uVar4;
            iVar3 = 3;
          }
        }
      }
    }
    else {
      if (c == '\n') goto LAB_002b192a;
LAB_002b1910:
      ::std::operator<<(local_1a8,c);
      iVar3 = 0;
    }
  } while (iVar3 == 0);
  if (iVar3 == 3) {
LAB_002b192a:
    (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
    (this->_curr_cursor).col = 0;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::operator=((string *)str,(string *)&c);
    ::std::__cxx11::string::_M_dispose();
    bVar2 = true;
  }
  else {
LAB_002b195c:
    bVar2 = false;
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return bVar2;
}

Assistant:

bool AsciiParser::ReadUntilNewline(std::string *str) {
  std::stringstream ss;

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '\n') {
      break;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          break;
        }

        // unwind 1 char
        if (!_sr->seek_from_current(-1)) {
          // this should not happen.
          return false;
        }

        break;
      }
    }

    ss << c;
  }

  _curr_cursor.row++;
  _curr_cursor.col = 0;

  (*str) = ss.str();

  return true;
}